

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O1

void __thiscall KokkosTools::SpaceTimeStack::State::State(State *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  undefined4 *puVar4;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  (this->stack_root).parent = (StackNode *)0x0;
  paVar1 = &(this->stack_root).name.field_2;
  (this->stack_root).name._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(this->stack_root).name.field_2 + 8) = uStack_20;
  }
  else {
    (this->stack_root).name._M_dataplus._M_p = local_38;
    (this->stack_root).name.field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (this->stack_root).name._M_string_length = local_30;
  local_30 = 0;
  local_28 = '\0';
  (this->stack_root).kind = STACK_REGION;
  p_Var2 = &(this->stack_root).children._M_t._M_impl.super__Rb_tree_header;
  (this->stack_root).children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stack_root).children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->stack_root).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->stack_root).children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->stack_root).children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stack_root).total_runtime = 0.0;
  (this->stack_root).total_kokkos_runtime = 0.0;
  (this->stack_root).number_of_calls = 0;
  (this->stack_root).total_number_of_kernel_calls = 0;
  (this->stack_root).start_time.impl.__d.__r = 0;
  this->stack_frame = &this->stack_root;
  lVar3 = -0x118;
  do {
    puVar4 = (undefined4 *)
             ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_color + lVar3);
    *(undefined8 *)((long)&this->hwm_allocations[0].total_size + lVar3) = 0;
    *puVar4 = 0;
    *(undefined8 *)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + lVar3) = 0;
    *(undefined4 **)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left
     + lVar3) = puVar4;
    *(undefined4 **)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_right + lVar3) = puVar4;
    *(undefined8 *)
     ((long)&this->hwm_allocations[0].alloc_set._M_t._M_impl.super__Rb_tree_header._M_node_count +
     lVar3) = 0;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0);
  lVar3 = -0x118;
  do {
    puVar4 = (undefined4 *)((long)&this[1].stack_root.name._M_string_length + lVar3);
    *(undefined8 *)((long)&this[1].stack_root.parent + lVar3) = 0;
    *puVar4 = 0;
    *(undefined8 *)((long)&this[1].stack_root.name.field_2 + lVar3) = 0;
    *(undefined4 **)((long)this[1].current_allocations + lVar3 + -0x80) = puVar4;
    *(undefined4 **)((long)this[1].current_allocations + lVar3 + -0x78) = puVar4;
    *(undefined8 *)
     (&(((set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
          *)(this[1].current_allocations + -2))->_M_t)._M_impl.field_0x0 + lVar3) = 0;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0);
  local_38 = &local_28;
  StackNode::begin(&this->stack_root);
  return;
}

Assistant:

State() : stack_root(nullptr, "", STACK_REGION), stack_frame(&stack_root) {
    stack_frame->begin();
  }